

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labpack-reader.c
# Opt level: O0

_Bool labpack_reader_begin_array_or_nil(labpack_reader_t *reader,uint32_t *count)

{
  _Bool _Var1;
  _Bool local_19;
  _Bool is_array;
  uint32_t *count_local;
  labpack_reader_t *reader_local;
  
  if (reader == (labpack_reader_t *)0x0) {
    __assert_fail("reader",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/fieldrndservices[P]labpack-c/src/labpack-reader.c"
                  ,0x192,"_Bool labpack_reader_begin_array_or_nil(labpack_reader_t *, uint32_t *)");
  }
  local_19 = false;
  _Var1 = labpack_reader_is_ok(reader);
  if (_Var1) {
    local_19 = mpack_expect_array_or_nil(reader->decoder,count);
    labpack_reader_check_decoder(reader);
  }
  return local_19;
}

Assistant:

bool
labpack_reader_begin_array_or_nil(labpack_reader_t* reader, uint32_t* count)
{
    assert(reader);
    bool is_array = false;
    if (labpack_reader_is_ok(reader)) {
        is_array = mpack_expect_array_or_nil(reader->decoder, count);
        labpack_reader_check_decoder(reader);
    }
    return is_array;
}